

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::XIncludeUtils::doDOMNodeXInclude
          (XIncludeUtils *this,DOMNode *xincludeNode,DOMDocument *parsedDocument,
          XMLEntityHandler *entityResolver)

{
  XMLCh XVar1;
  XMLCh XVar2;
  short sVar3;
  short sVar4;
  _func_int ***ppp_Var5;
  bool bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  XMLSize_t index;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMNode *pDVar10;
  long *plVar11;
  XMLCh *pXVar12;
  undefined4 extraout_var_01;
  DOMNode *pDVar13;
  long *plVar14;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  DOMDocument *pDVar15;
  undefined4 extraout_var_07;
  DOMText *pDVar16;
  undefined4 extraout_var_08;
  long lVar17;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  long *plVar18;
  undefined4 extraout_var_12;
  DOMNode *pDVar19;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  long *plVar20;
  short *psVar21;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined8 uVar22;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  XMLCh *pXVar23;
  DOMNode *pDVar24;
  short *psVar25;
  Codes CVar26;
  XMLCh *pXVar27;
  XMLSize_t XVar28;
  long lVar29;
  bool bVar30;
  XIncludeLocation hrefLoc;
  XIncludeLocation relativeLocation;
  XIncludeLocation xil;
  RefVectorOf<xercesc_4_0::DOMNode> delayedProcessing;
  XMLUri includedURI;
  XMLUri parentURI;
  DOMNode *local_170;
  XMLCh *local_160;
  long local_158;
  XMLCh *local_148;
  XIncludeLocation local_140;
  XIncludeLocation local_138;
  XMLEntityHandler *local_130;
  XIncludeLocation local_128;
  BaseRefVectorOf<xercesc_4_0::DOMNode> local_120;
  DOMNode *local_f0;
  DOMNode *local_e8;
  XMLUri local_e0;
  XMLUri local_88;
  
  pDVar13 = xincludeNode;
  local_130 = entityResolver;
  iVar8 = (*xincludeNode->_vptr_DOMNode[5])(xincludeNode);
  iVar9 = (*xincludeNode->_vptr_DOMNode[0x1a])(xincludeNode);
  local_e8 = (DOMNode *)CONCAT44(extraout_var,iVar8);
  if ((char)iVar9 == '\0') {
    bVar30 = true;
    local_160 = (XMLCh *)0x0;
    local_148 = (XMLCh *)0x0;
    local_170 = (DOMNode *)0x0;
  }
  else {
    iVar8 = (*xincludeNode->_vptr_DOMNode[0xb])(xincludeNode);
    plVar14 = (long *)CONCAT44(extraout_var_00,iVar8);
    pDVar10 = (DOMNode *)(**(code **)(*plVar14 + 0x28))(plVar14);
    if (pDVar10 == (DOMNode *)0x0) {
      bVar30 = true;
      local_160 = (XMLCh *)0x0;
      local_148 = (XMLCh *)0x0;
      local_170 = (DOMNode *)0x0;
    }
    else {
      local_170 = (DOMNode *)0x0;
      local_148 = (XMLCh *)0x0;
      local_158 = 0;
      local_160 = (XMLCh *)0x0;
      pDVar19 = (DOMNode *)0x0;
      do {
        pDVar13 = pDVar19;
        plVar11 = (long *)(**(code **)(*plVar14 + 0x18))(plVar14);
        pXVar12 = (XMLCh *)(**(code **)(*plVar11 + 0x140))(plVar11);
        if (pXVar12 == L"href") {
LAB_0033b4d2:
          local_170 = (DOMNode *)(**(code **)(*plVar11 + 0x150))(plVar11);
        }
        else {
          pXVar23 = L"href";
          if (pXVar12 == (XMLCh *)0x0) {
LAB_0033b49f:
            if (*pXVar23 == L'\0') goto LAB_0033b4d2;
          }
          else {
            pXVar23 = L"href";
            pXVar27 = pXVar12;
            do {
              XVar1 = *pXVar27;
              pDVar13 = (DOMNode *)(ulong)(ushort)XVar1;
              if (XVar1 == L'\0') goto LAB_0033b49f;
              pXVar27 = pXVar27 + 1;
              XVar2 = *pXVar23;
              pXVar23 = pXVar23 + 1;
            } while (XVar1 == XVar2);
          }
          if (pXVar12 == L"parse") {
LAB_0033b527:
            local_148 = (XMLCh *)(**(code **)(*plVar11 + 0x150))(plVar11);
          }
          else {
            pXVar23 = L"parse";
            if (pXVar12 == (XMLCh *)0x0) {
LAB_0033b4e8:
              if (*pXVar23 == L'\0') goto LAB_0033b527;
            }
            else {
              pXVar23 = L"parse";
              pXVar27 = pXVar12;
              do {
                XVar1 = *pXVar27;
                pDVar13 = (DOMNode *)(ulong)(ushort)XVar1;
                if (XVar1 == L'\0') goto LAB_0033b4e8;
                pXVar27 = pXVar27 + 1;
                XVar2 = *pXVar23;
                pXVar23 = pXVar23 + 1;
              } while (XVar1 == XVar2);
            }
            if (pXVar12 == L"xpointer") {
LAB_0033b576:
              local_158 = (**(code **)(*plVar11 + 0x150))(plVar11);
            }
            else {
              pXVar23 = L"xpointer";
              if (pXVar12 == (XMLCh *)0x0) {
LAB_0033b53a:
                if (*pXVar23 == L'\0') goto LAB_0033b576;
              }
              else {
                pXVar23 = L"xpointer";
                pXVar27 = pXVar12;
                do {
                  XVar1 = *pXVar27;
                  pDVar13 = (DOMNode *)(ulong)(ushort)XVar1;
                  if (XVar1 == L'\0') goto LAB_0033b53a;
                  pXVar27 = pXVar27 + 1;
                  XVar2 = *pXVar23;
                  pXVar23 = pXVar23 + 1;
                } while (XVar1 == XVar2);
              }
              if (pXVar12 == L"encoding") {
LAB_0033b59d:
                local_160 = (XMLCh *)(**(code **)(*plVar11 + 0x150))(plVar11);
              }
              else {
                pDVar24 = (DOMNode *)&fgXIIncludeEncodingAttrName;
                if (pXVar12 == (XMLCh *)0x0) {
LAB_0033b589:
                  if (*(XMLCh *)&pDVar24->_vptr_DOMNode == L'\0') goto LAB_0033b59d;
                }
                else {
                  pDVar24 = (DOMNode *)&fgXIIncludeEncodingAttrName;
                  do {
                    XVar1 = *pXVar12;
                    if (XVar1 == L'\0') goto LAB_0033b589;
                    pXVar12 = pXVar12 + 1;
                    pDVar13 = (DOMNode *)((long)&pDVar24->_vptr_DOMNode + 2);
                    ppp_Var5 = &pDVar24->_vptr_DOMNode;
                    pDVar24 = pDVar13;
                  } while (XVar1 == *(XMLCh *)ppp_Var5);
                }
                (**(code **)(*plVar11 + 0xb0))(plVar11);
              }
            }
          }
        }
        pDVar19 = (DOMNode *)((long)&pDVar19->_vptr_DOMNode + 1);
      } while (pDVar19 != pDVar10);
      bVar30 = local_158 == 0;
    }
  }
  iVar8 = (*xincludeNode->_vptr_DOMNode[7])();
  plVar14 = (long *)CONCAT44(extraout_var_01,iVar8);
  if (plVar14 == (long *)0x0) {
    plVar11 = (long *)0x0;
  }
  else {
    plVar11 = (long *)0x0;
    do {
      iVar8 = (**(code **)(*plVar14 + 0x20))(plVar14);
      if (iVar8 == 1) {
        pXVar12 = (XMLCh *)(**(code **)(*plVar14 + 0xc0))(plVar14);
        pDVar13 = (DOMNode *)(**(code **)(*plVar14 + 0xb0))(plVar14);
        bVar6 = isXIFallbackElement(pXVar12,(XMLCh *)pDVar13);
        if (bVar6) {
          bVar6 = plVar11 != (long *)0x0;
          plVar11 = plVar14;
          if (bVar6) {
            iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])
                              (parsedDocument);
            pXVar12 = (XMLCh *)CONCAT44(extraout_var_05,iVar8);
            iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])
                              (parsedDocument);
            pXVar23 = (XMLCh *)CONCAT44(extraout_var_06,iVar8);
            CVar26 = XIncludeMultipleFallbackElems;
            goto LAB_0033b84d;
          }
        }
        else {
          pXVar12 = (XMLCh *)(**(code **)(*plVar14 + 0xc0))(plVar14);
          pDVar13 = (DOMNode *)(**(code **)(*plVar14 + 0xb0))(plVar14);
          bVar6 = isXIIncludeElement(pXVar12,(XMLCh *)pDVar13);
          if ((bVar6) ||
             (pXVar12 = (XMLCh *)(**(code **)(*plVar14 + 0xb0))(plVar14),
             pXVar12 == L"http://www.w3.org/2001/XInclude")) {
LAB_0033b801:
            pXVar12 = (XMLCh *)(**(code **)(*plVar14 + 0x10))(plVar14);
            iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
            pXVar23 = (XMLCh *)CONCAT44(extraout_var_04,iVar8);
            CVar26 = XIncludeDisallowedChild;
LAB_0033b84d:
            reportError(this,pDVar13,CVar26,pXVar12,pXVar23);
            return false;
          }
          pDVar10 = (DOMNode *)&fgXIIIncludeNamespaceURI;
          if (pXVar12 == (XMLCh *)0x0) {
LAB_0033b6e0:
            if (*(XMLCh *)&pDVar10->_vptr_DOMNode == L'\0') goto LAB_0033b801;
          }
          else {
            pDVar10 = (DOMNode *)&fgXIIIncludeNamespaceURI;
            do {
              XVar1 = *pXVar12;
              if (XVar1 == L'\0') goto LAB_0033b6e0;
              pXVar12 = pXVar12 + 1;
              pDVar13 = (DOMNode *)((long)&pDVar10->_vptr_DOMNode + 2);
              ppp_Var5 = &pDVar10->_vptr_DOMNode;
              pDVar10 = pDVar13;
            } while (XVar1 == *(XMLCh *)ppp_Var5);
          }
        }
      }
      plVar14 = (long *)(**(code **)(*plVar14 + 0x50))(plVar14);
    } while (plVar14 != (long *)0x0);
  }
  if (local_170 == (DOMNode *)0x0) {
    iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
    local_170 = (DOMNode *)CONCAT44(extraout_var_03,iVar8);
    CVar26 = XIncludeNoHref;
LAB_0033b7f7:
    reportError(this,pDVar13,CVar26,(XMLCh *)0x0,(XMLCh *)local_170);
    return false;
  }
  pXVar12 = local_148;
  if (local_148 == (XMLCh *)0x0) {
    pXVar12 = L"xml";
  }
  if (!bVar30) {
    CVar26 = XIncludeXPointerNotSupported;
    goto LAB_0033b7f7;
  }
  XIncludeLocation::XIncludeLocation(&local_140,(XMLCh *)local_170);
  XIncludeLocation::XIncludeLocation(&local_138,(XMLCh *)local_170);
  iVar8 = (*xincludeNode->_vptr_DOMNode[0x1f])();
  pDVar13 = (DOMNode *)CONCAT44(extraout_var_02,iVar8);
  if (pDVar13 != (DOMNode *)0x0) {
    XIncludeLocation::prependPath(&local_140,(XMLCh *)pDVar13);
    local_170 = pDVar13;
  }
  pXVar23 = getBaseAttrValue(xincludeNode);
  if (pXVar23 != (XMLCh *)0x0) {
    local_170 = (DOMNode *)getBaseAttrValue(xincludeNode);
    XIncludeLocation::prependPath(&local_138,(XMLCh *)local_170);
  }
  if (pXVar12 == L"xml") {
LAB_0033b891:
    pDVar15 = doXIncludeXMLFileDOM
                        (this,local_140.fHref,local_138.fHref,xincludeNode,parsedDocument,local_130)
    ;
    pDVar16 = (DOMText *)0x0;
  }
  else {
    pDVar13 = (DOMNode *)0x0;
    do {
      psVar21 = (short *)((long)local_148 + (long)pDVar13);
      if (*psVar21 == 0) {
        if (*(short *)((long)&fgXIIncludeParseAttrXMLValue + (long)pDVar13) == 0) goto LAB_0033b891;
        break;
      }
      local_170 = (DOMNode *)((long)&pDVar13->_vptr_DOMNode + 2);
      psVar25 = (short *)((long)&fgXIIncludeParseAttrXMLValue + (long)pDVar13);
      pDVar13 = local_170;
    } while (*psVar21 == *psVar25);
    if (pXVar12 != L"text") {
      pDVar13 = (DOMNode *)0x0;
      do {
        psVar21 = (short *)((long)pXVar12 + (long)pDVar13);
        if (*psVar21 == 0) {
          if (*(short *)((long)&fgXIIncludeParseAttrTextValue + (long)pDVar13) == 0)
          goto LAB_0033b8e9;
          break;
        }
        local_170 = (DOMNode *)((long)&pDVar13->_vptr_DOMNode + 2);
        psVar25 = (short *)((long)&fgXIIncludeParseAttrTextValue + (long)pDVar13);
        pDVar13 = local_170;
      } while (*psVar21 == *psVar25);
      iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
      reportError(this,local_170,XIncludeInvalidParseVal,pXVar12,
                  (XMLCh *)CONCAT44(extraout_var_07,iVar8));
      bVar30 = false;
      goto LAB_0033c51c;
    }
LAB_0033b8e9:
    pDVar16 = doXIncludeTEXTFileDOM
                        (this,local_140.fHref,local_138.fHref,local_160,xincludeNode,parsedDocument,
                         local_130);
    pDVar15 = (DOMDocument *)0x0;
  }
  local_120._vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_004041b8;
  local_120.fAdoptedElems = false;
  local_120.fCurCount = 0;
  local_120.fMaxCount = 0xc;
  local_120.fElemList = (DOMNode **)0x0;
  local_120.fMemoryManager = XMLPlatformUtils::fgMemoryManager;
  pDVar13 = (DOMNode *)0x60;
  iVar8 = (*XMLPlatformUtils::fgMemoryManager->_vptr_MemoryManager[3])();
  local_120.fElemList = (DOMNode **)CONCAT44(extraout_var_08,iVar8);
  lVar17 = 0;
  do {
    local_120.fElemList[lVar17] = (DOMNode *)0x0;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0xc);
  local_120._vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00403db8;
  if (pDVar15 == (DOMDocument *)0x0 && pDVar16 == (DOMText *)0x0) {
    iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
    reportError(this,pDVar13,XIncludeIncludeFailedResourceError,local_140.fHref,
                (XMLCh *)CONCAT44(extraout_var_09,iVar8));
    pDVar10 = &parsedDocument->super_DOMNode;
    if (local_e8 != (DOMNode *)0x0) {
      pDVar10 = local_e8;
    }
    if (plVar11 == (long *)0x0) {
      iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
      iVar9 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0x1a])();
      reportError(this,pDVar13,XIncludeIncludeFailedNoFallback,
                  (XMLCh *)CONCAT44(extraout_var_34,iVar8),(XMLCh *)CONCAT44(extraout_var_35,iVar9))
      ;
LAB_0033c468:
      bVar30 = false;
    }
    else {
      iVar8 = (*pDVar10->_vptr_DOMNode[0x1f])(pDVar10);
      XMLUri::XMLUri(&local_88,(XMLCh *)CONCAT44(extraout_var_10,iVar8),
                     XMLPlatformUtils::fgMemoryManager);
      pXVar12 = (XMLCh *)(**(code **)(*plVar11 + 0xf8))(plVar11);
      XMLUri::XMLUri(&local_e0,pXVar12,XMLPlatformUtils::fgMemoryManager);
      cVar7 = (**(code **)(*plVar11 + 0x90))(plVar11);
      if (cVar7 == '\0') {
        (*pDVar10->_vptr_DOMNode[0x10])(pDVar10,xincludeNode);
      }
      else {
        iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[4])();
        plVar14 = (long *)CONCAT44(extraout_var_11,iVar8);
        plVar18 = (long *)(**(code **)(*plVar11 + 0x38))(plVar11);
        for (; plVar18 != (long *)0x0; plVar18 = (long *)(**(code **)(*plVar18 + 0x50))(plVar18)) {
          iVar8 = (**(code **)(*plVar18 + 0x20))(plVar18);
          if (iVar8 != 10) {
            iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xf])
                              (parsedDocument,plVar18,1);
            pDVar13 = (DOMNode *)CONCAT44(extraout_var_12,iVar8);
            iVar8 = (*pDVar13->_vptr_DOMNode[4])(pDVar13);
            if ((iVar8 == 1) && (local_88.fPath != local_e0.fPath)) {
              pXVar12 = local_e0.fPath;
              pXVar23 = local_88.fPath;
              if (local_e0.fPath == (XMLCh *)0x0 || local_88.fPath == (XMLCh *)0x0) {
                if (local_88.fPath == (XMLCh *)0x0) {
                  if (local_e0.fPath == (XMLCh *)0x0) goto LAB_0033bbcb;
LAB_0033bb20:
                  XVar1 = *pXVar12;
                }
                else {
                  XVar1 = *local_88.fPath;
                  if (XVar1 == L'\0' && local_e0.fPath != (XMLCh *)0x0) goto LAB_0033bb20;
                }
                if (XVar1 == L'\0') goto LAB_0033bbcb;
              }
              else {
                do {
                  XVar1 = *pXVar23;
                  if (XVar1 == L'\0') goto LAB_0033bb20;
                  pXVar23 = pXVar23 + 1;
                  XVar2 = *pXVar12;
                  pXVar12 = pXVar12 + 1;
                } while (XVar1 == XVar2);
              }
              pXVar12 = getBaseAttrValue(pDVar13);
              if (pXVar12 == (XMLCh *)0x0) {
                pDVar19 = (DOMNode *)(**(code **)(*plVar11 + 0x28))(plVar11);
                pXVar12 = getBaseAttrValue(pDVar19);
                (*pDVar13->_vptr_DOMNode[0x2c])(pDVar13,&fgXIBaseAttrName,pXVar12);
              }
              else {
                pXVar12 = getBaseAttrValue(pDVar13);
                XIncludeLocation::XIncludeLocation(&local_128,pXVar12);
                pDVar19 = (DOMNode *)(**(code **)(*plVar11 + 0x28))(plVar11);
                pXVar12 = getBaseAttrValue(pDVar19);
                if (pXVar12 != (XMLCh *)0x0) {
                  pDVar19 = (DOMNode *)(**(code **)(*plVar11 + 0x28))(plVar11);
                  pXVar12 = getBaseAttrValue(pDVar19);
                  XIncludeLocation::prependPath(&local_128,pXVar12);
                }
                (*pDVar13->_vptr_DOMNode[0x2c])(pDVar13,&fgXIBaseAttrName,local_128.fHref);
                XIncludeLocation::~XIncludeLocation(&local_128);
              }
            }
LAB_0033bbcb:
            pDVar13 = (DOMNode *)(**(code **)(*plVar14 + 0x88))(plVar14,pDVar13);
            BaseRefVectorOf<xercesc_4_0::DOMNode>::ensureExtraCapacity(&local_120,1);
            local_120.fElemList[local_120.fCurCount] = pDVar13;
            local_120.fCurCount = local_120.fCurCount + 1;
          }
        }
        (*pDVar10->_vptr_DOMNode[0xf])(pDVar10,plVar14,xincludeNode);
        (**(code **)(*plVar14 + 0x138))(plVar14);
        if (local_120.fCurCount != 0) {
          XVar28 = 0;
          do {
            pDVar13 = BaseRefVectorOf<xercesc_4_0::DOMNode>::elementAt(&local_120,XVar28);
            parseDOMNodeDoingXInclude(this,pDVar13,parsedDocument,local_130);
            XVar28 = XVar28 + 1;
          } while (XVar28 < local_120.fCurCount);
        }
      }
      XMLUri::~XMLUri(&local_e0);
      XMLUri::~XMLUri(&local_88);
LAB_0033c4f8:
      bVar30 = true;
      if (pDVar15 != (DOMDocument *)0x0) {
        (*(pDVar15->super_DOMNode)._vptr_DOMNode[0x27])(&pDVar15->super_DOMNode);
      }
    }
  }
  else {
    if (pDVar15 != (DOMDocument *)0x0) {
      addDocumentURIToCurrentInclusionHistoryStack(this,local_140.fHref);
      iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[4])();
      local_f0 = (DOMNode *)CONCAT44(extraout_var_13,iVar8);
      iVar8 = (*(pDVar15->super_DOMNode)._vptr_DOMNode[7])(&pDVar15->super_DOMNode);
      pDVar13 = &parsedDocument->super_DOMNode;
      for (plVar14 = (long *)CONCAT44(extraout_var_14,iVar8); plVar14 != (long *)0x0;
          plVar14 = (long *)(**(code **)(*plVar14 + 0x50))(plVar14)) {
        iVar8 = (**(code **)(*plVar14 + 0x20))(plVar14);
        if (iVar8 != 10) {
          iVar8 = (**(code **)(*plVar14 + 0x20))(plVar14);
          if ((iVar8 == 1) &&
             (iVar8 = (*(pDVar15->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])(),
             CONCAT44(extraout_var_15,iVar8) != 0)) {
            plVar11 = (long *)(**(code **)(*plVar14 + 0x58))();
            lVar17 = (**(code **)(*plVar11 + 0x28))(plVar11);
            if (lVar17 != 0) {
              lVar29 = 0;
              do {
                plVar18 = (long *)(**(code **)(*plVar11 + 0x18))(plVar11,lVar29);
                plVar20 = (long *)(**(code **)(*plVar18 + 0x170))(plVar18);
                if (plVar20 != (long *)0x0) {
                  psVar21 = (short *)(**(code **)(*plVar20 + 0x18))(plVar20);
                  if (psVar21 == &XMLUni::fgInfosetURIName) {
LAB_0033bd42:
                    psVar21 = (short *)(**(code **)(*plVar20 + 0x10))(plVar20);
                    if (psVar21 == &XMLUni::fgNotationString) {
LAB_0033bdd9:
                      pDVar10 = (DOMNode *)(**(code **)(*plVar18 + 0x18))(plVar18);
                      iVar8 = (*(pDVar15->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])();
                      plVar18 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_16,iVar8) +
                                                    0x150))((long *)CONCAT44(extraout_var_16,iVar8))
                      ;
                      plVar18 = (long *)(**(code **)(*plVar18 + 0x20))(plVar18,pDVar10);
                      iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb]
                              )(parsedDocument);
                      if (CONCAT44(extraout_var_17,iVar8) == 0) {
                        iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0xd])(parsedDocument);
                        uVar22 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar8) + 0x10))
                                           ((long *)CONCAT44(extraout_var_18,iVar8));
                        iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0x24])(parsedDocument,uVar22,0,0);
                        iVar9 = (*pDVar13->_vptr_DOMNode[7])();
                        (*pDVar13->_vptr_DOMNode[0xe])
                                  (pDVar13,CONCAT44(extraout_var_19,iVar8),
                                   CONCAT44(extraout_var_20,iVar9));
                      }
                      iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb]
                              )(parsedDocument);
                      plVar20 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_21,iVar8) +
                                                    0x150))((long *)CONCAT44(extraout_var_21,iVar8))
                      ;
                      pDVar19 = pDVar10;
                      plVar20 = (long *)(**(code **)(*plVar20 + 0x20))(plVar20);
                      if (plVar20 == (long *)0x0) {
                        iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0xb])();
                        plVar20 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_22,iVar8) +
                                                      0x150))((long *)CONCAT44(extraout_var_22,iVar8
                                                                              ));
                        iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0xf])(parsedDocument,plVar18,1);
                        (**(code **)(*plVar20 + 0x10))(plVar20,iVar8);
                        goto LAB_0033c329;
                      }
                      psVar25 = (short *)(**(code **)(*plVar20 + 0x140))(plVar20);
                      psVar21 = (short *)(**(code **)(*plVar18 + 0x140))(plVar18);
                      if (psVar25 == psVar21) {
LAB_0033c0e7:
                        psVar25 = (short *)(**(code **)(*plVar20 + 0x148))(plVar20);
                        psVar21 = (short *)(**(code **)(*plVar18 + 0x148))(plVar18);
                        if (psVar25 != psVar21) {
                          if ((psVar25 != (short *)0x0) && (psVar21 != (short *)0x0)) {
                            do {
                              sVar3 = *psVar25;
                              if (sVar3 == 0) goto LAB_0033c154;
                              psVar25 = psVar25 + 1;
                              sVar4 = *psVar21;
                              psVar21 = psVar21 + 1;
                            } while (sVar3 == sVar4);
                            goto LAB_0033c265;
                          }
                          if (psVar25 == (short *)0x0) {
                            if (psVar21 == (short *)0x0) goto LAB_0033c15e;
LAB_0033c154:
                            sVar3 = *psVar21;
                          }
                          else {
                            sVar3 = *psVar25;
                            if ((psVar21 != (short *)0x0) && (sVar3 == 0)) goto LAB_0033c154;
                          }
                          if (sVar3 != 0) goto LAB_0033c265;
                        }
LAB_0033c15e:
                        psVar25 = (short *)(**(code **)(*plVar20 + 0xf8))(plVar20);
                        psVar21 = (short *)(**(code **)(*plVar18 + 0xf8))(plVar18);
                        if (psVar25 == psVar21) goto LAB_0033c329;
                        if ((psVar25 != (short *)0x0) && (psVar21 != (short *)0x0)) {
                          do {
                            sVar3 = *psVar25;
                            if (sVar3 == 0) goto LAB_0033c25b;
                            psVar25 = psVar25 + 1;
                            sVar4 = *psVar21;
                            psVar21 = psVar21 + 1;
                          } while (sVar3 == sVar4);
                          goto LAB_0033c265;
                        }
                        if (psVar25 == (short *)0x0) {
                          if (psVar21 == (short *)0x0) goto LAB_0033c329;
LAB_0033c25b:
                          sVar3 = *psVar21;
                        }
                        else {
                          sVar3 = *psVar25;
                          if ((psVar21 != (short *)0x0) && (sVar3 == 0)) goto LAB_0033c25b;
                        }
                        if (sVar3 == 0) goto LAB_0033c329;
                      }
                      else if ((psVar25 == (short *)0x0) || (psVar21 == (short *)0x0)) {
                        if (psVar25 == (short *)0x0) {
                          if (psVar21 == (short *)0x0) goto LAB_0033c0e7;
LAB_0033c0dd:
                          sVar3 = *psVar21;
                        }
                        else {
                          sVar3 = *psVar25;
                          if ((psVar21 != (short *)0x0) && (sVar3 == 0)) goto LAB_0033c0dd;
                        }
                        if (sVar3 == 0) goto LAB_0033c0e7;
                      }
                      else {
                        do {
                          sVar3 = *psVar25;
                          if (sVar3 == 0) goto LAB_0033c0dd;
                          psVar25 = psVar25 + 1;
                          sVar4 = *psVar21;
                          psVar21 = psVar21 + 1;
                        } while (sVar3 == sVar4);
                      }
LAB_0033c265:
                      iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                [0x1a])();
                      reportError(this,pDVar19,XIncludeConflictingNotation,(XMLCh *)pDVar10,
                                  (XMLCh *)CONCAT44(extraout_var_30,iVar8));
                    }
                    else {
                      psVar25 = &XMLUni::fgNotationString;
                      if (psVar21 == (short *)0x0) {
LAB_0033bd85:
                        if (*psVar25 == 0) goto LAB_0033bdd9;
                      }
                      else {
                        psVar25 = &XMLUni::fgNotationString;
                        do {
                          sVar3 = *psVar21;
                          if (sVar3 == 0) goto LAB_0033bd85;
                          psVar21 = psVar21 + 1;
                          sVar4 = *psVar25;
                          psVar25 = psVar25 + 1;
                        } while (sVar3 == sVar4);
                      }
                      psVar21 = (short *)(**(code **)(*plVar20 + 0x10))(plVar20);
                      if (psVar21 == &XMLUni::fgEntityString) {
LAB_0033bf37:
                        pDVar10 = (DOMNode *)(**(code **)(*plVar18 + 0x18))(plVar18);
                        iVar8 = (*(pDVar15->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xb])();
                        plVar18 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_23,iVar8) +
                                                      0x148))((long *)CONCAT44(extraout_var_23,iVar8
                                                                              ));
                        plVar18 = (long *)(**(code **)(*plVar18 + 0x20))(plVar18,pDVar10);
                        iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0xb])(parsedDocument);
                        if (CONCAT44(extraout_var_24,iVar8) == 0) {
                          iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                    [0xd])(parsedDocument);
                          uVar22 = (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar8) + 0x10))
                                             ((long *)CONCAT44(extraout_var_25,iVar8));
                          iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                    [0x24])(parsedDocument,uVar22,0,0);
                          iVar9 = (*pDVar13->_vptr_DOMNode[7])();
                          (*pDVar13->_vptr_DOMNode[0xe])
                                    (pDVar13,CONCAT44(extraout_var_26,iVar8),
                                     CONCAT44(extraout_var_27,iVar9));
                        }
                        iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                  [0xb])(parsedDocument);
                        plVar20 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_28,iVar8) +
                                                      0x148))((long *)CONCAT44(extraout_var_28,iVar8
                                                                              ));
                        pDVar19 = pDVar10;
                        plVar20 = (long *)(**(code **)(*plVar20 + 0x20))(plVar20);
                        if (plVar20 == (long *)0x0) {
                          iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                    [0xb])();
                          plVar20 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_29,iVar8) +
                                                        0x148))((long *)CONCAT44(extraout_var_29,
                                                                                 iVar8));
                          iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                    [0xf])(parsedDocument,plVar18,1);
                          (**(code **)(*plVar20 + 0x10))(plVar20,iVar8);
                        }
                        else {
                          psVar25 = (short *)(**(code **)(*plVar20 + 0x140))(plVar20);
                          psVar21 = (short *)(**(code **)(*plVar18 + 0x140))(plVar18);
                          if (psVar25 == psVar21) {
LAB_0033c1e6:
                            psVar25 = (short *)(**(code **)(*plVar20 + 0x148))(plVar20);
                            psVar21 = (short *)(**(code **)(*plVar18 + 0x148))(plVar18);
                            if (psVar25 != psVar21) {
                              if ((psVar25 != (short *)0x0) && (psVar21 != (short *)0x0)) {
                                do {
                                  sVar3 = *psVar25;
                                  if (sVar3 == 0) goto LAB_0033c294;
                                  psVar25 = psVar25 + 1;
                                  sVar4 = *psVar21;
                                  psVar21 = psVar21 + 1;
                                } while (sVar3 == sVar4);
                                goto LAB_0033c304;
                              }
                              if (psVar25 == (short *)0x0) {
                                if (psVar21 == (short *)0x0) goto LAB_0033c29a;
LAB_0033c294:
                                sVar3 = *psVar21;
                              }
                              else {
                                sVar3 = *psVar25;
                                if ((psVar21 != (short *)0x0) && (sVar3 == 0)) goto LAB_0033c294;
                              }
                              if (sVar3 != 0) goto LAB_0033c304;
                            }
LAB_0033c29a:
                            psVar25 = (short *)(**(code **)(*plVar20 + 0xf8))(plVar20);
                            psVar21 = (short *)(**(code **)(*plVar18 + 0xf8))(plVar18);
                            if (psVar25 == psVar21) goto LAB_0033c329;
                            if ((psVar25 != (short *)0x0) && (psVar21 != (short *)0x0)) {
                              do {
                                sVar3 = *psVar25;
                                if (sVar3 == 0) goto LAB_0033c2fe;
                                psVar25 = psVar25 + 1;
                                sVar4 = *psVar21;
                                psVar21 = psVar21 + 1;
                              } while (sVar3 == sVar4);
                              goto LAB_0033c304;
                            }
                            if (psVar25 == (short *)0x0) {
                              if (psVar21 == (short *)0x0) goto LAB_0033c329;
LAB_0033c2fe:
                              sVar3 = *psVar21;
                            }
                            else {
                              sVar3 = *psVar25;
                              if ((psVar21 != (short *)0x0) && (sVar3 == 0)) goto LAB_0033c2fe;
                            }
                            if (sVar3 == 0) goto LAB_0033c329;
                          }
                          else if ((psVar25 == (short *)0x0) || (psVar21 == (short *)0x0)) {
                            if (psVar25 == (short *)0x0) {
                              if (psVar21 == (short *)0x0) goto LAB_0033c1e6;
LAB_0033c1dc:
                              sVar3 = *psVar21;
                            }
                            else {
                              sVar3 = *psVar25;
                              if ((psVar21 != (short *)0x0) && (sVar3 == 0)) goto LAB_0033c1dc;
                            }
                            if (sVar3 == 0) goto LAB_0033c1e6;
                          }
                          else {
                            do {
                              sVar3 = *psVar25;
                              if (sVar3 == 0) goto LAB_0033c1dc;
                              psVar25 = psVar25 + 1;
                              sVar4 = *psVar21;
                              psVar21 = psVar21 + 1;
                            } while (sVar3 == sVar4);
                          }
LAB_0033c304:
                          iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange
                                    [0x1a])();
                          reportError(this,pDVar19,XIncludeConflictingEntity,(XMLCh *)pDVar10,
                                      (XMLCh *)CONCAT44(extraout_var_31,iVar8));
                        }
                      }
                      else {
                        psVar25 = &XMLUni::fgEntityString;
                        if (psVar21 == (short *)0x0) {
LAB_0033bf2d:
                          if (*psVar25 == 0) goto LAB_0033bf37;
                        }
                        else {
                          psVar25 = &XMLUni::fgEntityString;
                          do {
                            sVar3 = *psVar21;
                            if (sVar3 == 0) goto LAB_0033bf2d;
                            psVar21 = psVar21 + 1;
                            sVar4 = *psVar25;
                            psVar25 = psVar25 + 1;
                          } while (sVar3 == sVar4);
                        }
                      }
                    }
                  }
                  else {
                    psVar25 = &XMLUni::fgInfosetURIName;
                    if (psVar21 == (short *)0x0) {
LAB_0033bd38:
                      if (*psVar25 == 0) goto LAB_0033bd42;
                    }
                    else {
                      psVar25 = &XMLUni::fgInfosetURIName;
                      do {
                        sVar3 = *psVar21;
                        if (sVar3 == 0) goto LAB_0033bd38;
                        psVar21 = psVar21 + 1;
                        sVar4 = *psVar25;
                        psVar25 = psVar25 + 1;
                      } while (sVar3 == sVar4);
                    }
                  }
                }
LAB_0033c329:
                lVar29 = lVar29 + 1;
              } while (lVar29 != lVar17);
            }
          }
          iVar8 = (*(parsedDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xf])
                            (parsedDocument,plVar14,1);
          iVar8 = (*local_f0->_vptr_DOMNode[0x11])(local_f0,CONCAT44(extraout_var_32,iVar8));
          BaseRefVectorOf<xercesc_4_0::DOMNode>::ensureExtraCapacity(&local_120,1);
          local_120.fElemList[local_120.fCurCount] = (DOMNode *)CONCAT44(extraout_var_33,iVar8);
          local_120.fCurCount = local_120.fCurCount + 1;
        }
      }
      pDVar13 = local_f0;
      (*local_e8->_vptr_DOMNode[0xf])(local_e8,local_f0,xincludeNode);
      (*local_f0->_vptr_DOMNode[0x27])();
      if (local_120.fCurCount != 0) {
        XVar28 = 0;
        do {
          pDVar13 = BaseRefVectorOf<xercesc_4_0::DOMNode>::elementAt(&local_120,XVar28);
          parseDOMNodeDoingXInclude(this,pDVar13,parsedDocument,local_130);
          XVar28 = XVar28 + 1;
        } while (XVar28 < local_120.fCurCount);
      }
      popFromCurrentInclusionHistoryStack(this,(XMLCh *)pDVar13);
      goto LAB_0033c4f8;
    }
    if (pDVar16 == (DOMText *)0x0) goto LAB_0033c468;
    bVar30 = true;
    (*local_e8->_vptr_DOMNode[0xf])(local_e8,pDVar16,xincludeNode);
  }
  RefVectorOf<xercesc_4_0::DOMNode>::~RefVectorOf((RefVectorOf<xercesc_4_0::DOMNode> *)&local_120);
LAB_0033c51c:
  XIncludeLocation::~XIncludeLocation(&local_138);
  XIncludeLocation::~XIncludeLocation(&local_140);
  return bVar30;
}

Assistant:

bool
XIncludeUtils::doDOMNodeXInclude(DOMNode *xincludeNode, DOMDocument *parsedDocument, XMLEntityHandler* entityResolver){
    bool modifiedNode = false;
    /* the relevant attributes to look for */
    const XMLCh *href = NULL;
    const XMLCh *parse = NULL;
    const XMLCh *xpointer = NULL;
    const XMLCh *encoding = NULL;
//    const XMLCh *accept = NULL;
//    const XMLCh *acceptlanguage = NULL;
    DOMNode *includeParent = xincludeNode->getParentNode();


    if(xincludeNode->hasAttributes()) {
        /* get all the attributes of the node */
        DOMNamedNodeMap *pAttributes = xincludeNode->getAttributes();
        XMLSize_t nSize = pAttributes->getLength();
        for(XMLSize_t i=0;i<nSize;++i) {
            DOMAttr *pAttributeNode = (DOMAttr*) pAttributes->item(i);
            const XMLCh *attrName = pAttributeNode->getName();
            /* check each attribute against the potential useful names */
            if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeHREFAttrName)){
                href = pAttributeNode->getValue();
            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeParseAttrName)){
                parse = pAttributeNode->getValue();
            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeXPointerAttrName)){
                xpointer = pAttributeNode->getValue();
            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeEncodingAttrName)){
                encoding = pAttributeNode->getValue();
//            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeAcceptAttrName)){
//                accept = pAttributeNode->getValue();
//            } else if (XMLString::equals(attrName, XIncludeUtils::fgXIIncludeAcceptLanguageAttrName)){
//                acceptlanguage = pAttributeNode->getValue();
            } else {
                /* if any other attribute is in the xi namespace, it's an error */
                const XMLCh *attrNamespaceURI = pAttributeNode->getNamespaceURI();
                if (attrNamespaceURI && XMLString::equals(attrNamespaceURI, XIncludeUtils::fgXIIIncludeNamespaceURI)){
                } else {
                    /* ignore - any other attribute is allowed according to spec,
                       and must be ignored */
                }
            }
        }
    }
    // 3.1 xi:include Element
    // The children property of the xi:include element may include a single xi:fallback element;
    // the appearance of more than one xi:fallback element, an xi:include element,
    // or any other element from the XInclude namespace is a fatal error.
    DOMNode *child;
    DOMElement *fallback = NULL;
    for (child = xincludeNode->getFirstChild(); child != 0; child=child->getNextSibling()){
        if(child->getNodeType()!=DOMNode::ELEMENT_NODE)
            continue;
        if ( isXIFallbackDOMNode(child) ){
            if (fallback != NULL){
                /* fatal error - there are more than one fallback children */
                XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeMultipleFallbackElems,
                    parsedDocument->getDocumentURI(), parsedDocument->getDocumentURI());
                return false;
            }
            fallback = (DOMElement*)child;
        }
        else if(isXIIncludeDOMNode(child) || XMLString::equals(child->getNamespaceURI(), XIncludeUtils::fgXIIIncludeNamespaceURI)) {
            /* fatal error - an xi element different from xi:fallback is a child of xi:include */
            XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeDisallowedChild,
                child->getNodeName(), parsedDocument->getDocumentURI());
            return false;
        }
    }

    if (href == NULL){
        /* this is an unrecoverable error until we have xpointer support -
           if there is an xpointer, the current document is assumed
           however, there is no xpointer support yet */
        XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeNoHref,
            NULL, parsedDocument->getDocumentURI());
        return false;
    }

    /* set up the accept and accept-language values */
//    if (accept != NULL){
//
//    }

    if (parse == NULL){
        /* use the default, as specified */
        parse = XIncludeUtils::fgXIIncludeParseAttrXMLValue;
    }

    if (xpointer != NULL){
        /* not supported yet */
        /* Note that finding an xpointer attr along with parse="text" is a Fatal Error
         *  - http://www.w3.org/TR/xinclude/#include-location */
        XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeXPointerNotSupported,
            NULL, href);
        return false;
    }

    /* set up the href according to what has gone before */
    XIncludeLocation hrefLoc(href);
    XIncludeLocation relativeLocation(href);
    const XMLCh *includeBase = xincludeNode->getBaseURI();
    if (includeBase != NULL){
        hrefLoc.prependPath(includeBase);
    }

    if (getBaseAttrValue(xincludeNode) != NULL){
        relativeLocation.prependPath(getBaseAttrValue(xincludeNode));
    }

    /*  Take the relevant action - we need to retrieve the target as a whole before
        we can know if it was successful or not, therefore the do* methods do
        not modify the parsedDocument. Swapping the results in is left to the
        caller (i.e. here) */
    DOMText *includedText = NULL;
    DOMDocument *includedDoc = NULL;
    if (XMLString::equals(parse, XIncludeUtils::fgXIIncludeParseAttrXMLValue)){
        /* including a XML element */
        includedDoc = doXIncludeXMLFileDOM(hrefLoc.getLocation(), relativeLocation.getLocation(), xincludeNode, parsedDocument, entityResolver);
    } else if (XMLString::equals(parse, XIncludeUtils::fgXIIncludeParseAttrTextValue)){
        /* including a text value */
        includedText = doXIncludeTEXTFileDOM(hrefLoc.getLocation(), relativeLocation.getLocation(), encoding, xincludeNode, parsedDocument, entityResolver);
    } else {
        /* invalid parse attribute value - fatal error according to the specification */
        XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeInvalidParseVal,
            parse, parsedDocument->getDocumentURI());
        return false;
    }

    RefVectorOf<DOMNode> delayedProcessing(12,false);
    if (includedDoc == NULL && includedText == NULL){
        /* there was an error - this is now a resource error
           let's see if there is a fallback */
        XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeIncludeFailedResourceError,
            hrefLoc.getLocation(), parsedDocument->getDocumentURI());

        if (includeParent == NULL){
            includeParent = parsedDocument;
        }

        // we could be getting errors trying to insert elements at the root of the document, so we should use replaceChild;
        // in order to handle multiple nodes, add them to a document fragment and use that to replace the original node
        if (fallback){
            /* baseURI fixups - see http://www.w3.org/TR/xinclude/#base for details. */
            XMLUri parentURI(includeParent->getBaseURI());
            XMLUri includedURI(fallback->getBaseURI());

            if (fallback->hasChildNodes()){
                DOMDocumentFragment* frag = parsedDocument->createDocumentFragment();
                DOMNode *child = fallback->getFirstChild();
                /* add the content of the fallback element, and remove the fallback elem itself */
                for ( ; child != NULL ; child=child->getNextSibling()){
                    if (child->getNodeType() == DOMNode::DOCUMENT_TYPE_NODE){
                        continue;
                    }
                    DOMNode *newNode = parsedDocument->importNode(child, true);
                    /* if the paths differ we need to add a base attribute */
                    if (newNode->getNodeType()==DOMNode::ELEMENT_NODE && !XMLString::equals(parentURI.getPath(), includedURI.getPath())){
                        if (getBaseAttrValue(newNode) == NULL){
                            /* need to calculate the proper path difference to get the relativePath */
                            ((DOMElement*)newNode)->setAttribute(fgXIBaseAttrName, getBaseAttrValue(fallback->getParentNode()));
                        } else {
                            /* the included node has base of its own which takes precedence */
                            XIncludeLocation xil(getBaseAttrValue(newNode));
                            if (getBaseAttrValue(fallback->getParentNode()) != NULL){
                                /* prepend any specific base modification of the xinclude node */
                                xil.prependPath(getBaseAttrValue(fallback->getParentNode()));
                            }
                            ((DOMElement*)newNode)->setAttribute(fgXIBaseAttrName, xil.getLocation());
                        }
                    }
                    DOMNode *newChild = frag->appendChild(newNode);
                    // don't process the node now, wait until it is placed in the final position
                    delayedProcessing.addElement(newChild);
                    //parseDOMNodeDoingXInclude(newChild, parsedDocument, entityResolver);
                }
                includeParent->replaceChild(frag, xincludeNode);
                frag->release();

                for(XMLSize_t i=0;i<delayedProcessing.size();i++)
                {
                    DOMNode* childNode=delayedProcessing.elementAt(i);
                    parseDOMNodeDoingXInclude(childNode, parsedDocument, entityResolver);
                }
                modifiedNode = true;
            } else {
                /* empty fallback element - simply remove it! */
                includeParent->removeChild(xincludeNode);
                modifiedNode = true;
            }
        } else {
            XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeIncludeFailedNoFallback,
                parsedDocument->getDocumentURI(), parsedDocument->getDocumentURI());
            return false;
        }
    } else {
        if (includedDoc){
            /* record the successful include while we process the children */
            addDocumentURIToCurrentInclusionHistoryStack(hrefLoc.getLocation());

            DOMDocumentFragment* frag = parsedDocument->createDocumentFragment();
            /* need to import the document prolog here */
            DOMNode *child = includedDoc->getFirstChild();
            for (; child != NULL; child = child->getNextSibling()) {
                if (child->getNodeType() == DOMNode::DOCUMENT_TYPE_NODE)
                    continue;
                // check for NOTATION or ENTITY clash
                if(child->getNodeType()==DOMNode::ELEMENT_NODE && includedDoc->getDoctype()!=NULL) {
                    DOMNamedNodeMap *pAttributes = child->getAttributes();
                    XMLSize_t nSize = pAttributes->getLength();
                    for(XMLSize_t i=0;i<nSize;++i) {
                        DOMAttr *pAttributeNode = (DOMAttr*) pAttributes->item(i);
                        const DOMTypeInfo * typeInfo=pAttributeNode->getSchemaTypeInfo();
                        if(typeInfo && XMLString::equals(typeInfo->getTypeNamespace(), XMLUni::fgInfosetURIName)) {
                            if(XMLString::equals(typeInfo->getTypeName(), XMLUni::fgNotationString)) {
                                const XMLCh* notationName=pAttributeNode->getNodeValue();
                                DOMNotation* notat=(DOMNotation*)includedDoc->getDoctype()->getNotations()->getNamedItem(notationName);
                                // ensure we have a DTD
                                if(parsedDocument->getDoctype()==NULL)
                                    parsedDocument->insertBefore(parsedDocument->createDocumentType(parsedDocument->getDocumentElement()->getNodeName(), NULL,NULL), parsedDocument->getFirstChild());
                                DOMNotation* myNotation=(DOMNotation*)parsedDocument->getDoctype()->getNotations()->getNamedItem(notationName);
                                if(myNotation==NULL)
                                {
                                    // it's missing, add it
                                    parsedDocument->getDoctype()->getNotations()->setNamedItem(parsedDocument->importNode(notat, true));
                                }
                                else if(XMLString::equals(myNotation->getPublicId(), notat->getPublicId()) &&
                                        XMLString::equals(myNotation->getSystemId(), notat->getSystemId()) &&
                                        XMLString::equals(myNotation->getBaseURI(), notat->getBaseURI()))
                                {
                                    // it's duplicate, ignore it
                                }
                                else
                                {
                                    // it's a conflict, report it
                                    XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeConflictingNotation,
                                        notationName, parsedDocument->getDocumentURI());
                                }
                            }
                            else if(XMLString::equals(typeInfo->getTypeName(), XMLUni::fgEntityString)) {
                                const XMLCh* entityName=pAttributeNode->getNodeValue();
                                DOMEntity* ent=(DOMEntity*)includedDoc->getDoctype()->getEntities()->getNamedItem(entityName);
                                // ensure we have a DTD
                                if(parsedDocument->getDoctype()==NULL)
                                    parsedDocument->insertBefore(parsedDocument->createDocumentType(parsedDocument->getDocumentElement()->getNodeName(), NULL,NULL), parsedDocument->getFirstChild());
                                DOMEntity* myEnt=(DOMEntity*)parsedDocument->getDoctype()->getEntities()->getNamedItem(entityName);
                                if(myEnt==NULL)
                                {
                                    // it's missing, add it
                                    parsedDocument->getDoctype()->getEntities()->setNamedItem(parsedDocument->importNode(ent, true));
                                }
                                else if(XMLString::equals(myEnt->getPublicId(), ent->getPublicId()) &&
                                        XMLString::equals(myEnt->getSystemId(), ent->getSystemId()) &&
                                        XMLString::equals(myEnt->getBaseURI(), ent->getBaseURI()))
                                {
                                    // it's duplicate, ignore it
                                }
                                else
                                {
                                    // it's a conflict, report it
                                    XIncludeUtils::reportError(xincludeNode, XMLErrs::XIncludeConflictingEntity,
                                        entityName, parsedDocument->getDocumentURI());
                                }
                            }
                        }
                    }
                }
                DOMNode *newNode = parsedDocument->importNode(child, true);
                DOMNode *newChild = frag->appendChild(newNode);
                // don't process the node now, wait until it is placed in the final position
                delayedProcessing.addElement(newChild);
                //parseDOMNodeDoingXInclude(newChild, parsedDocument, entityResolver);
            }
            includeParent->replaceChild(frag, xincludeNode);
            frag->release();

            for(XMLSize_t i=0;i<delayedProcessing.size();i++)
            {
                DOMNode* childNode=delayedProcessing.elementAt(i);
                parseDOMNodeDoingXInclude(childNode, parsedDocument, entityResolver);
            }
            popFromCurrentInclusionHistoryStack(NULL);
            modifiedNode = true;
        } else if (includedText){
            includeParent->replaceChild(includedText, xincludeNode);
            modifiedNode = true;
        }
    }

    if (includedDoc)
        includedDoc->release();

    return modifiedNode;
}